

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestEmptyMessageWithExtensions::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  TestEmptyMessageWithExtensions **v1;
  TestEmptyMessageWithExtensions **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  anon_union_32_1_493b367e_for_TestEmptyMessageWithExtensions_3 *this;
  TestEmptyMessageWithExtensions *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestEmptyMessageWithExtensions *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestEmptyMessageWithExtensions *from;
  TestEmptyMessageWithExtensions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestEmptyMessageWithExtensions *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestEmptyMessageWithExtensions *)to_msg;
  _this = (TestEmptyMessageWithExtensions *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestEmptyMessageWithExtensions_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestEmptyMessageWithExtensions*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestEmptyMessageWithExtensions_const*,edition_unittest::TestEmptyMessageWithExtensions*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x4eed,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = &from->field_0;
  extendee = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(this->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestEmptyMessageWithExtensions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestEmptyMessageWithExtensions*>(&to_msg);
  auto& from = static_cast<const TestEmptyMessageWithExtensions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestEmptyMessageWithExtensions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}